

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O1

void commit(uint8_t *digest,uint8_t *seed,uint8_t *aux,uint8_t *salt,size_t t,size_t j,
           picnic_instance_t *params)

{
  uint capacity;
  uint rate;
  hash_context ctx;
  undefined2 local_11a;
  uint8_t *local_118;
  Keccak_HashInstance local_110;
  
  if (params->digest_size == ' ') {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  local_118 = digest;
  Keccak_HashInitialize(&local_110,rate,capacity,0,'\x1f');
  Keccak_HashUpdate(&local_110,seed,(ulong)params->seed_size << 3);
  if (aux != (uint8_t *)0x0) {
    Keccak_HashUpdate(&local_110,aux,(ulong)params->view_size << 3);
  }
  Keccak_HashUpdate(&local_110,salt,0x100);
  local_11a = (undefined2)t;
  Keccak_HashUpdate(&local_110,(BitSequence *)&local_11a,0x10);
  local_11a = (undefined2)j;
  Keccak_HashUpdate(&local_110,(BitSequence *)&local_11a,0x10);
  Keccak_HashFinal(&local_110,(BitSequence *)0x0);
  Keccak_HashSqueeze(&local_110,local_118,(ulong)params->digest_size << 3);
  return;
}

Assistant:

static void commit(uint8_t* digest, const uint8_t* seed, const uint8_t* aux, const uint8_t* salt,
                   size_t t, size_t j, const picnic_instance_t* params) {
  /* Compute C[t][j];  as digest = H(seed||[aux]) aux is optional */
  hash_context ctx;

  hash_init(&ctx, params->digest_size);
  hash_update(&ctx, seed, params->seed_size);
  if (aux != NULL) {
    hash_update(&ctx, aux, params->view_size);
  }
  hash_update(&ctx, salt, SALT_SIZE);
  hash_update_uint16_le(&ctx, t);
  hash_update_uint16_le(&ctx, j);
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, params->digest_size);
  hash_clear(&ctx);
}